

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O1

OnigCalloutFunc onig_get_callout_start_func(regex_t *reg,int callout_num)

{
  RegexExt *pRVar1;
  CalloutListEntry *pCVar2;
  
  pRVar1 = reg->extp;
  if ((callout_num < 1 || pRVar1 == (RegexExt *)0x0) || (pRVar1->callout_num < callout_num)) {
    pCVar2 = (CalloutListEntry *)0x0;
  }
  else {
    pCVar2 = pRVar1->callout_list + ((ulong)(uint)callout_num - 1);
  }
  if (pCVar2 != (CalloutListEntry *)0x0) {
    return pCVar2->start_func;
  }
  return (OnigCalloutFunc)0x0;
}

Assistant:

extern CalloutListEntry*
onig_reg_callout_list_at(regex_t* reg, int num)
{
  RegexExt* ext = reg->extp;
  CHECK_NULL_RETURN(ext);

  if (num <= 0 || num > ext->callout_num)
    return 0;

  num--;
  return ext->callout_list + num;
}